

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O1

bool helics::helicsBoolValue(string_view val)

{
  undefined1 uVar1;
  const_iterator pvVar2;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  pvVar2 = frozen::
           unordered_map<std::basic_string_view<char,std::char_traits<char>>,bool,37ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
           ::
           find<std::basic_string_view<char,std::char_traits<char>>,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                     ((unordered_map<std::basic_string_view<char,std::char_traits<char>>,bool,37ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                       *)&helicsBoolValue::knownStrings,&local_10,
                      (elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                      &helicsBoolValue::knownStrings.tables_.field_0x408,
                      (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                      &helicsBoolValue::knownStrings);
  if ((tables_type *)pvVar2 == &helicsBoolValue::knownStrings.tables_) {
    uVar1 = 1;
  }
  else {
    uVar1 = pvVar2->second;
  }
  return (bool)uVar1;
}

Assistant:

bool helicsBoolValue(std::string_view val)
{
    static constexpr const frozen::unordered_map<std::string_view, bool, 37> knownStrings{

        {"0", false},
        {"00", false},
        {std::string_view("\0", 1), false},
        {"0000", false},
        {std::string_view("\0\0\0\0\0\0\0\0", 8), false},
        {"1", true},
        {"false", false},
        {"true", true},
        {"on", true},
        {"off", false},
        {"ON", true},
        {"OFF", false},
        {"False", false},
        {"True", true},
        {"FALSE", false},
        {"TRUE", true},
        {"f", false},
        {"-", false},
        {"t", true},
        {"+", true},
        {"F", false},
        {"T", true},
        {"n", false},
        {"y", true},
        {"N", false},
        {"Y", true},
        {"no", false},
        {"yes", true},
        {"No", false},
        {"Yes", true},
        {"NO", false},
        {"YES", true},
        {"disable", false},
        {"enable", true},
        {"disabled", false},
        {"enabled", true},
        {"", false}};
    // all known false strings are captured in known strings so if it isn't in there it evaluates to
    // true
    const auto* res = knownStrings.find(val);
    if (res != knownStrings.end()) {
        return res->second;
    }
    return true;
}